

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::
     PrintSmartPointer<qclab::QObject<std::complex<float>>,std::unique_ptr<qclab::QObject<std::complex<float>>,std::default_delete<qclab::QObject<std::complex<float>>>>,void>
               (unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
                *ptr,ostream *os,int param_3)

{
  ostream *poVar1;
  char *pcVar2;
  
  if ((ptr->_M_t).
      super___uniq_ptr_impl<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_qclab::QObject<std::complex<float>_>_*,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
      .super__Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false>._M_head_impl ==
      (QObject<std::complex<float>_> *)0x0) {
    pcVar2 = "(nullptr)";
  }
  else {
    poVar1 = std::operator<<(os,"(ptr = ");
    poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
    std::operator<<(poVar1,", value = ");
    RawBytesPrinter::PrintValue<qclab::QObject<std::complex<float>>,8ul>
              ((ptr->_M_t).
               super___uniq_ptr_impl<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_qclab::QObject<std::complex<float>_>_*,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
               .super__Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false>._M_head_impl,os
              );
    pcVar2 = ")";
  }
  std::operator<<(os,pcVar2);
  return;
}

Assistant:

void PrintSmartPointer(const Ptr& ptr, std::ostream* os, int) {
  if (ptr == nullptr) {
    *os << "(nullptr)";
  } else {
    *os << "(ptr = " << (VoidifyPointer)(ptr.get()) << ", value = ";
    UniversalPrinter<T>::Print(*ptr, os);
    *os << ")";
  }
}